

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::MatchPrintAndExplain<leveldb::Status_const,leveldb::Status_const&>
               (Status *value,Matcher<const_leveldb::Status_&> *matcher,
               MatchResultListener *listener)

{
  element_type *peVar1;
  ostream *poVar2;
  undefined1 uVar3;
  StringMatchResultListener inner_listener;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  int iVar4;
  
  if (listener->stream_ == (ostream *)0x0) {
    local_1c0 = (undefined1 *)0x0;
    local_1c8 = &PTR__MatchResultListener_00155c70;
    peVar1 = (matcher->super_MatcherBase<const_leveldb::Status_&>).impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_leveldb::Status_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar1,value);
    uVar3 = (undefined1)iVar4;
  }
  else {
    local_1c0 = local_1a8;
    local_1c8 = &PTR__StringMatchResultListener_00155cb0;
    std::__cxx11::stringstream::stringstream(local_1b8);
    peVar1 = (matcher->super_MatcherBase<const_leveldb::Status_&>).impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_leveldb::Status_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar1,value,&local_1c8);
    uVar3 = (undefined1)iVar4;
    PrintBytesInObjectTo((uchar *)value,8,listener->stream_);
    std::__cxx11::stringbuf::str();
    poVar2 = listener->stream_;
    iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
    if ((poVar2 != (ostream *)0x0) && (iVar4 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    local_1c8 = &PTR__StringMatchResultListener_00155cb0;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return (bool)uVar3;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}